

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

void __thiscall CConnman::PushMessage(CConnman *this,CNode *pnode,CSerializedNetMsg *msg)

{
  Span<const_unsigned_char> __args_2;
  string_view logging_function;
  bool bVar1;
  byte bVar2;
  int iVar3;
  pointer pTVar4;
  __tuple_element_t<1UL,_tuple<Span<const_unsigned_char>,_bool,_const_basic_string<char,_char_traits<char>,_allocator<char>_>_&>_>
  *p_Var5;
  size_t sVar6;
  undefined4 extraout_var;
  char *in_RDX;
  unsigned_long *unaff_RBX;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  pair<unsigned_long,_bool> pVar7;
  long *unaff_retaddr;
  bool queue_was_empty;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *_msg_type;
  type *more;
  type *to_send;
  size_t nBytesSent;
  size_t nMessageSize;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock104;
  undefined4 in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe3c;
  char *in_stack_fffffffffffffe40;
  CAddress *in_stack_fffffffffffffe48;
  _Any_data *in_stack_fffffffffffffe50;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe58;
  uchar *in_stack_fffffffffffffe60;
  char *in_stack_fffffffffffffe68;
  AnnotatedMixin<std::mutex> *in_stack_fffffffffffffe70;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  char *in_stack_fffffffffffffe80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe88;
  long lVar8;
  bool local_169;
  LogFlags in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffeac;
  ConstevalFormatString<3U> in_stack_fffffffffffffee8;
  string_view in_stack_fffffffffffffef0;
  CNode *in_stack_ffffffffffffff40;
  CConnman *in_stack_ffffffffffffff48;
  allocator<char> local_81;
  basic_string_view<char,_std::char_traits<char>_> local_80 [2];
  _Any_data local_58;
  undefined1 local_48;
  Level in_stack_ffffffffffffffe0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  
  args = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
          (in_FS_OFFSET + 0x28);
  AssertLockNotHeldInline
            ((char *)in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c,
             (Mutex *)0x221c3d);
  local_58._M_unused._M_member_pointer =
       std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                  CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  bVar1 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),Trace);
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50->_M_pod_data);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50->_M_pod_data);
    in_stack_fffffffffffffe40 = "sending %s (%d bytes) peer=%d\n";
    in_stack_fffffffffffffe48 = (CAddress *)(in_RDX + 0x18);
    local_80[0]._M_len =
         CNode::GetId((CNode *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    in_stack_fffffffffffffe50 = &local_58;
    in_stack_fffffffffffffe58 = local_80;
    in_stack_fffffffffffffe38 = 1;
    logging_function._M_str = in_RDX;
    logging_function._M_len = (size_t)in_stack_fffffffffffffe40;
    LogPrintFormatInternal<std::__cxx11::string,unsigned_long,long>
              (logging_function,in_stack_fffffffffffffef0,in_stack_fffffffffffffeac,
               in_stack_fffffffffffffea0,in_stack_ffffffffffffffe0,in_stack_fffffffffffffee8,args,
               unaff_RBX,unaff_retaddr);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
  bVar2 = ArgsManager::GetBoolArg
                    ((ArgsManager *)in_stack_fffffffffffffe40,
                     (string *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                     SUB81((ulong)in_stack_fffffffffffffe48 >> 0x38,0));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  std::allocator<char>::~allocator(&local_81);
  if ((bVar2 & 1) != 0) {
    Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((Span<const_unsigned_char> *)in_stack_fffffffffffffe48,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe40,
               (type)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    __args_2.m_size = (size_t)in_stack_fffffffffffffe68;
    __args_2.m_data = in_stack_fffffffffffffe60;
    std::
    function<void_(const_CAddress_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_Span<const_unsigned_char>,_bool)>
    ::operator()((function<void_(const_CAddress_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_Span<const_unsigned_char>,_bool)>
                  *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe40,__args_2,
                 SUB81((ulong)in_stack_fffffffffffffe58 >> 0x38,0));
  }
  MaybeCheckNotHeld((Mutex *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
             CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),in_stack_fffffffffffffe70
             ,in_stack_fffffffffffffe68,(char *)in_stack_fffffffffffffe60,
             (int)((ulong)in_stack_fffffffffffffe58 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffe58 >> 0x18,0));
  pTVar4 = std::unique_ptr<Transport,_std::default_delete<Transport>_>::operator->
                     ((unique_ptr<Transport,_std::default_delete<Transport>_> *)
                      CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  (*pTVar4->_vptr_Transport[7])(&stack0xffffffffffffff40,pTVar4,1);
  std::get<0ul,Span<unsigned_char_const>,bool,std::__cxx11::string_const&>
            ((tuple<Span<const_unsigned_char>,_bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  p_Var5 = std::get<1ul,Span<unsigned_char_const>,bool,std::__cxx11::string_const&>
                     ((tuple<Span<const_unsigned_char>,_bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                       *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  std::get<2ul,Span<unsigned_char_const>,bool,std::__cxx11::string_const&>
            ((tuple<Span<const_unsigned_char>,_bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  bVar1 = Span<const_unsigned_char>::empty
                    ((Span<const_unsigned_char> *)
                     CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  local_169 = false;
  if (bVar1) {
    local_169 = std::deque<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>::empty
                          ((deque<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_> *)
                           CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  }
  sVar6 = CSerializedNetMsg::GetMemoryUsage((CSerializedNetMsg *)in_stack_fffffffffffffe48);
  *(size_t *)(in_RSI + 0x20) = sVar6 + *(long *)(in_RSI + 0x20);
  lVar8 = *(long *)(in_RSI + 0x20);
  pTVar4 = std::unique_ptr<Transport,_std::default_delete<Transport>_>::operator->
                     ((unique_ptr<Transport,_std::default_delete<Transport>_> *)
                      CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  iVar3 = (*pTVar4->_vptr_Transport[9])();
  if ((ulong)*(uint *)(in_RDI + 0x88) < (ulong)(lVar8 + CONCAT44(extraout_var,iVar3))) {
    std::atomic<bool>::operator=
              ((atomic<bool> *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),false);
  }
  std::deque<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>::push_back
            ((deque<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_> *)
             CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),(value_type *)0x221fef);
  if ((local_169 != false) && ((*p_Var5 & 1U) != 0)) {
    pVar7 = SocketSendData(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    local_58._8_8_ = pVar7.first;
    local_48 = pVar7.second;
    std::tie<unsigned_long,std::_Swallow_assign_const>
              ((unsigned_long *)in_stack_fffffffffffffe40,
               (_Swallow_assign *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    std::tuple<unsigned_long&,std::_Swallow_assign_const&>::operator=
              ((tuple<unsigned_long_&,_const_std::_Swallow_assign_&> *)in_stack_fffffffffffffe58,
               (pair<unsigned_long,_bool> *)in_stack_fffffffffffffe50);
  }
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
             CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  if (*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(in_FS_OFFSET + 0x28)
      == args) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CConnman::PushMessage(CNode* pnode, CSerializedNetMsg&& msg)
{
    AssertLockNotHeld(m_total_bytes_sent_mutex);
    size_t nMessageSize = msg.data.size();
    LogDebug(BCLog::NET, "sending %s (%d bytes) peer=%d\n", msg.m_type, nMessageSize, pnode->GetId());
    if (gArgs.GetBoolArg("-capturemessages", false)) {
        CaptureMessage(pnode->addr, msg.m_type, msg.data, /*is_incoming=*/false);
    }

    TRACE6(net, outbound_message,
        pnode->GetId(),
        pnode->m_addr_name.c_str(),
        pnode->ConnectionTypeAsString().c_str(),
        msg.m_type.c_str(),
        msg.data.size(),
        msg.data.data()
    );

    size_t nBytesSent = 0;
    {
        LOCK(pnode->cs_vSend);
        // Check if the transport still has unsent bytes, and indicate to it that we're about to
        // give it a message to send.
        const auto& [to_send, more, _msg_type] =
            pnode->m_transport->GetBytesToSend(/*have_next_message=*/true);
        const bool queue_was_empty{to_send.empty() && pnode->vSendMsg.empty()};

        // Update memory usage of send buffer.
        pnode->m_send_memusage += msg.GetMemoryUsage();
        if (pnode->m_send_memusage + pnode->m_transport->GetSendMemoryUsage() > nSendBufferMaxSize) pnode->fPauseSend = true;
        // Move message to vSendMsg queue.
        pnode->vSendMsg.push_back(std::move(msg));

        // If there was nothing to send before, and there is now (predicted by the "more" value
        // returned by the GetBytesToSend call above), attempt "optimistic write":
        // because the poll/select loop may pause for SELECT_TIMEOUT_MILLISECONDS before actually
        // doing a send, try sending from the calling thread if the queue was empty before.
        // With a V1Transport, more will always be true here, because adding a message always
        // results in sendable bytes there, but with V2Transport this is not the case (it may
        // still be in the handshake).
        if (queue_was_empty && more) {
            std::tie(nBytesSent, std::ignore) = SocketSendData(*pnode);
        }
    }
    if (nBytesSent) RecordBytesSent(nBytesSent);
}